

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.c
# Opt level: O3

Qiniu_Error Qiniu_FileSystem_Recorder_New(char *rootPath,Qiniu_Recorder *recorder)

{
  size_t sVar1;
  char *__dest;
  Qiniu_Error QVar2;
  
  sVar1 = strlen(rootPath);
  __dest = (char *)calloc(1,sVar1 + 1);
  strcpy(__dest,rootPath);
  recorder->open = _Qiniu_FileSystem_Recorder_Open;
  recorder->remove = _Qiniu_FileSystem_Recorder_Remove;
  recorder->free = _Qiniu_FileSystem_Recorder_Free;
  recorder->data = __dest;
  QVar2._4_4_ = 0;
  QVar2.code = Qiniu_OK.code;
  QVar2.message = Qiniu_OK.message;
  return QVar2;
}

Assistant:

Qiniu_Error
Qiniu_FileSystem_Recorder_New(const char *rootPath, Qiniu_Recorder *recorder)
{
    char *newRootPath = malloc(strlen(rootPath) + 1);
    memset((void *)newRootPath, '\0', strlen(rootPath) + 1);
    strcpy(newRootPath, rootPath);

    recorder->open = _Qiniu_FileSystem_Recorder_Open;
    recorder->remove = _Qiniu_FileSystem_Recorder_Remove;
    recorder->free = _Qiniu_FileSystem_Recorder_Free;
    recorder->data = (void *)newRootPath;
    return Qiniu_OK;
}